

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O0

void update_sharpness(loop_filter_info_n *lfi,int sharpness_lvl)

{
  int in_ESI;
  long in_RDI;
  int block_inside_limit;
  int lvl;
  uint local_14;
  int local_10;
  
  for (local_10 = 0; local_10 < 0x40; local_10 = local_10 + 1) {
    local_14 = local_10 >> (0 < in_ESI) + (4 < in_ESI);
    if ((0 < in_ESI) && (9 - in_ESI < (int)local_14)) {
      local_14 = 9 - in_ESI;
    }
    if ((int)local_14 < 1) {
      local_14 = 1;
    }
    memset((void *)(in_RDI + (long)local_10 * 0x30 + 0x10),local_14 & 0xff,0x10);
    memset((void *)(in_RDI + (long)local_10 * 0x30),(local_10 + 2) * 2 + local_14 & 0xff,0x10);
  }
  return;
}

Assistant:

static void update_sharpness(loop_filter_info_n *lfi, int sharpness_lvl) {
  int lvl;

  // For each possible value for the loop filter fill out limits
  for (lvl = 0; lvl <= MAX_LOOP_FILTER; lvl++) {
    // Set loop filter parameters that control sharpness.
    int block_inside_limit = lvl >> ((sharpness_lvl > 0) + (sharpness_lvl > 4));

    if (sharpness_lvl > 0) {
      if (block_inside_limit > (9 - sharpness_lvl))
        block_inside_limit = (9 - sharpness_lvl);
    }

    if (block_inside_limit < 1) block_inside_limit = 1;

    memset(lfi->lfthr[lvl].lim, block_inside_limit, SIMD_WIDTH);
    memset(lfi->lfthr[lvl].mblim, (2 * (lvl + 2) + block_inside_limit),
           SIMD_WIDTH);
  }
}